

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O0

char * Fverb::parameter_unit(uint index)

{
  char *pcStack_10;
  uint index_local;
  
  switch(index) {
  case 0:
    pcStack_10 = "ms";
    break;
  case 1:
    pcStack_10 = "%";
    break;
  case 2:
    pcStack_10 = "Hz";
    break;
  case 3:
    pcStack_10 = "Hz";
    break;
  case 4:
    pcStack_10 = "%";
    break;
  case 5:
    pcStack_10 = "%";
    break;
  case 6:
    pcStack_10 = "%";
    break;
  case 7:
    pcStack_10 = "%";
    break;
  case 8:
    pcStack_10 = "Hz";
    break;
  case 9:
    pcStack_10 = "Hz";
    break;
  case 10:
    pcStack_10 = "ms";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *Fverb::parameter_unit(unsigned index) noexcept
{
    switch (index) {

    case 0:
        return "ms";

    case 1:
        return "%";

    case 2:
        return "Hz";

    case 3:
        return "Hz";

    case 4:
        return "%";

    case 5:
        return "%";

    case 6:
        return "%";

    case 7:
        return "%";

    case 8:
        return "Hz";

    case 9:
        return "Hz";

    case 10:
        return "ms";

    default:
        return 0;
    }
}